

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jzon.cpp
# Opt level: O3

Node __thiscall Jzon::Parser::parseStream(Parser *this,istream *stream)

{
  istream *in_RDX;
  undefined1 auStack_c8 [8];
  TokenQueue tokens;
  DataQueue data;
  
  tokens.c.super__Deque_base<Jzon::Parser::Token,_std::allocator<Jzon::Parser::Token>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  tokens.c.super__Deque_base<Jzon::Parser::Token,_std::allocator<Jzon::Parser::Token>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  tokens.c.super__Deque_base<Jzon::Parser::Token,_std::allocator<Jzon::Parser::Token>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  tokens.c.super__Deque_base<Jzon::Parser::Token,_std::allocator<Jzon::Parser::Token>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  tokens.c.super__Deque_base<Jzon::Parser::Token,_std::allocator<Jzon::Parser::Token>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  tokens.c.super__Deque_base<Jzon::Parser::Token,_std::allocator<Jzon::Parser::Token>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  tokens.c.super__Deque_base<Jzon::Parser::Token,_std::allocator<Jzon::Parser::Token>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  tokens.c.super__Deque_base<Jzon::Parser::Token,_std::allocator<Jzon::Parser::Token>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  auStack_c8 = (undefined1  [8])0x0;
  tokens.c.super__Deque_base<Jzon::Parser::Token,_std::allocator<Jzon::Parser::Token>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  std::_Deque_base<Jzon::Parser::Token,_std::allocator<Jzon::Parser::Token>_>::_M_initialize_map
            ((_Deque_base<Jzon::Parser::Token,_std::allocator<Jzon::Parser::Token>_> *)auStack_c8,0)
  ;
  tokens.c.super__Deque_base<Jzon::Parser::Token,_std::allocator<Jzon::Parser::Token>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::
  _Deque_base<std::pair<Jzon::Node::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<Jzon::Node::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_M_initialize_map((_Deque_base<std::pair<Jzon::Node::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<Jzon::Node::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)&tokens.c.
                          super__Deque_base<Jzon::Parser::Token,_std::allocator<Jzon::Parser::Token>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_node,0);
  tokenize((Parser *)stream,in_RDX,(TokenQueue *)auStack_c8,
           (DataQueue *)
           &tokens.c.super__Deque_base<Jzon::Parser::Token,_std::allocator<Jzon::Parser::Token>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_node);
  assemble(this,(TokenQueue *)stream,(DataQueue *)auStack_c8);
  std::
  deque<std::pair<Jzon::Node::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<Jzon::Node::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~deque((deque<std::pair<Jzon::Node::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<Jzon::Node::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)&tokens.c.super__Deque_base<Jzon::Parser::Token,_std::allocator<Jzon::Parser::Token>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node);
  std::_Deque_base<Jzon::Parser::Token,_std::allocator<Jzon::Parser::Token>_>::~_Deque_base
            ((_Deque_base<Jzon::Parser::Token,_std::allocator<Jzon::Parser::Token>_> *)auStack_c8);
  return (Node)(Data *)this;
}

Assistant:

Node Parser::parseStream(std::istream &stream)
	{
		TokenQueue tokens;
		DataQueue data;

		tokenize(stream, tokens, data);
		Node node = assemble(tokens, data);

		return node;
	}